

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TransformFeedbackBufferStorageTestCase::initDataBO
          (TransformFeedbackBufferStorageTestCase *this)

{
  GLenum GVar1;
  
  initTestData(this);
  (*this->m_gl->genBuffers)(1,&this->m_data_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1709);
  (*this->m_gl->bindBuffer)(0x8892,this->m_data_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x170c);
  (*this->m_gl->bufferStorage)(0x8892,(ulong)this->m_data_bo_size,(void *)0x0,0x100);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBufferStorage() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x170f);
  (*this->m_gl->bufferSubData)
            (0x8892,(ulong)this->m_data_bo_indexed_indirect_arg_offset,
             (ulong)this->m_indirect_arg_data_size,this->m_indirect_arg_data);
  (*this->m_gl->bufferSubData)
            (0x8892,(ulong)this->m_data_bo_index_data_offset,(ulong)this->m_index_data_size,
             this->m_index_data);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBufferSubData() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1714);
  (*this->m_gl->genBuffers)(1,&this->m_helper_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x171e);
  (*this->m_gl->bindBuffer)(0x8892,this->m_helper_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1721);
  (*this->m_gl->bufferStorage)(0x8892,(ulong)this->m_result_bo_size,(void *)0x0,1);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBufferStorage() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1725);
  return;
}

Assistant:

void TransformFeedbackBufferStorageTestCase::initDataBO()
{
	initTestData();

	/* Initialize data BO (the BO which holds index + indirect draw call args */
	DE_ASSERT(m_data_bo == 0);

	m_gl.genBuffers(1, &m_data_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenBuffers() call failed.");

	m_gl.bindBuffer(GL_ARRAY_BUFFER, m_data_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bufferStorage(GL_ARRAY_BUFFER, m_data_bo_size, DE_NULL, GL_DYNAMIC_STORAGE_BIT);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferStorage() call failed.");

	m_gl.bufferSubData(GL_ARRAY_BUFFER, m_data_bo_indexed_indirect_arg_offset, m_indirect_arg_data_size,
					   m_indirect_arg_data);
	m_gl.bufferSubData(GL_ARRAY_BUFFER, m_data_bo_index_data_offset, m_index_data_size, m_index_data);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferSubData() call(s) failed.");

	/* Generate & bind a helper BO we need to copy the data to from the sparse BO
	 * if direct mapping is not possible.
	 */
	DE_ASSERT(m_result_bo_size != 0);
	DE_ASSERT(m_result_bo == 0);
	DE_ASSERT(m_helper_bo == 0);

	m_gl.genBuffers(1, &m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenBuffers() call failed.");

	m_gl.bindBuffer(GL_ARRAY_BUFFER, m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bufferStorage(GL_ARRAY_BUFFER, m_result_bo_size, DE_NULL, /* data */
					   GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferStorage() call failed.");
}